

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_zone.cpp
# Opt level: O2

void __thiscall
sf2cute::SFInstrumentZone::SFInstrumentZone
          (SFInstrumentZone *this,weak_ptr<sf2cute::SFSample> *sample)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  SFZone::SFZone(&this->super_SFZone);
  (this->super_SFZone)._vptr_SFZone = (_func_int **)&PTR__SFInstrumentZone_0011d7c8;
  p_Var1 = (sample->super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (sample->super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  (sample->super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (sample->super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->parent_instrument_ = (SFInstrument *)0x0;
  return;
}

Assistant:

SFInstrumentZone::SFInstrumentZone(std::weak_ptr<SFSample> sample) :
    sample_(std::move(sample)),
    parent_instrument_(nullptr) {
}